

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MockExpectedCallTest.cpp
# Opt level: O0

void __thiscall
TEST_MockExpectedCall_callWithStringParameter_Test::testBody
          (TEST_MockExpectedCall_callWithStringParameter_Test *this)

{
  MockCheckedExpectedCall *pMVar1;
  UtestShell *pUVar2;
  char *pcVar3;
  TestTerminator *pTVar4;
  char *pcVar5;
  SimpleString local_a8;
  MockNamedValue local_98;
  SimpleString local_48 [2];
  char *local_28;
  char *value;
  SimpleString paramName;
  TEST_MockExpectedCall_callWithStringParameter_Test *this_local;
  
  paramName.bufferSize_ = (size_t)this;
  SimpleString::SimpleString((SimpleString *)&value,"paramName");
  local_28 = "hello world";
  MockExpectedCall::withParameter
            (&((this->super_TEST_GROUP_CppUTestGroupMockExpectedCall).call)->super_MockExpectedCall,
             (SimpleString *)&value,"hello world");
  pUVar2 = UtestShell::getCurrent();
  pMVar1 = (this->super_TEST_GROUP_CppUTestGroupMockExpectedCall).call;
  (*(pMVar1->super_MockExpectedCall)._vptr_MockExpectedCall[0x28])(local_48,pMVar1,&value);
  pcVar3 = SimpleString::asCharString(local_48);
  pTVar4 = UtestShell::getCurrentTestTerminator();
  (*pUVar2->_vptr_UtestShell[9])
            (pUVar2,"const char*",pcVar3,0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTestExt/MockExpectedCallTest.cpp"
             ,0x120,pTVar4);
  SimpleString::~SimpleString(local_48);
  pUVar2 = UtestShell::getCurrent();
  pcVar3 = local_28;
  pMVar1 = (this->super_TEST_GROUP_CppUTestGroupMockExpectedCall).call;
  (*(pMVar1->super_MockExpectedCall)._vptr_MockExpectedCall[0x26])(&local_98,pMVar1,&value);
  pcVar5 = MockNamedValue::getStringValue(&local_98);
  pTVar4 = UtestShell::getCurrentTestTerminator();
  (*pUVar2->_vptr_UtestShell[9])
            (pUVar2,pcVar3,pcVar5,0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTestExt/MockExpectedCallTest.cpp"
             ,0x121,pTVar4);
  MockNamedValue::~MockNamedValue(&local_98);
  pUVar2 = UtestShell::getCurrent();
  (*(((this->super_TEST_GROUP_CppUTestGroupMockExpectedCall).call)->super_MockExpectedCall).
    _vptr_MockExpectedCall[0x3c])(&local_a8);
  pcVar3 = SimpleString::asCharString(&local_a8);
  (*pUVar2->_vptr_UtestShell[0xc])
            (pUVar2,"funcName -> const char* paramName: <hello world>",pcVar3,0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTestExt/MockExpectedCallTest.cpp"
             ,0x122);
  SimpleString::~SimpleString(&local_a8);
  SimpleString::~SimpleString((SimpleString *)&value);
  return;
}

Assistant:

TEST(MockExpectedCall, callWithStringParameter)
{
    const SimpleString paramName = "paramName";
    const char* value = "hello world";
    call->withParameter(paramName, value);
    STRCMP_EQUAL("const char*", call->getInputParameterType(paramName).asCharString());
    STRCMP_EQUAL(value, call->getInputParameter(paramName).getStringValue());
    STRCMP_CONTAINS("funcName -> const char* paramName: <hello world>", call->callToString().asCharString());
}